

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

bool __thiscall duckdb_shell::ShellState::OpenDatabase(ShellState *this,char **azArg,idx_t nArg)

{
  char *pcVar1;
  int iVar2;
  ulong in_RDX;
  long in_RSI;
  long *in_RDI;
  bool bVar3;
  char *z;
  idx_t iName_1;
  bool newFlag;
  idx_t iName;
  char *zNewFilename;
  char *in_stack_ffffffffffffff58;
  sqlite3 *in_stack_ffffffffffffff60;
  string local_88 [4];
  int in_stack_ffffffffffffff7c;
  ShellState *in_stack_ffffffffffffff80;
  ulong local_60;
  string local_58 [39];
  byte local_31;
  ulong local_30;
  char *local_28;
  ulong local_20;
  long local_18;
  
  if (safe_mode) {
    fprintf(_stderr,".open cannot be used in -safe mode\n");
    return false;
  }
  local_30 = 1;
  local_31 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  close_db(in_stack_ffffffffffffff60);
  *in_RDI = 0;
  globalDb = (sqlite3 *)0x0;
  std::__cxx11::string::string(local_58);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x28),local_58);
  std::__cxx11::string::~string(local_58);
  *(undefined1 *)(in_RDI + 1) = 0;
  *(uint *)((long)in_RDI + 0x14) = *(uint *)((long)in_RDI + 0x14) & 0xfeffffff;
  in_RDI[9] = 0;
  local_60 = 1;
  while( true ) {
    bVar3 = false;
    if (local_60 < local_20) {
      bVar3 = **(char **)(local_18 + local_60 * 8) == '-';
    }
    if (!bVar3) break;
    pcVar1 = *(char **)(local_18 + local_60 * 8);
    iVar2 = optionMatch(in_stack_ffffffffffffff58,(char *)0x1dfc73);
    if (iVar2 == 0) {
      iVar2 = optionMatch(in_stack_ffffffffffffff58,(char *)0x1dfc93);
      if (iVar2 == 0) {
        iVar2 = optionMatch(in_stack_ffffffffffffff58,(char *)0x1dfcb4);
        if (iVar2 == 0) {
          if (*pcVar1 == '-') {
            fprintf(_stderr,"unknown option: %s\n",pcVar1);
            return false;
          }
        }
        else {
          *(uint *)((long)in_RDI + 0x14) = *(uint *)((long)in_RDI + 0x14) | 0x1000000;
        }
      }
      else {
        *(undefined1 *)(in_RDI + 1) = 4;
      }
    }
    else {
      local_31 = 1;
    }
    local_60 = local_60 + 1;
  }
  if (local_30 < local_20) {
    local_28 = duckdb_shell_sqlite3_mprintf("%s",*(undefined8 *)(local_18 + local_30 * 8));
  }
  else {
    local_28 = (char *)0x0;
  }
  if ((local_28 != (char *)0x0) || ((char)in_RDI[1] == '\x06')) {
    if ((local_31 & 1) != 0) {
      shellDeleteFile(local_28);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 0x28),local_28);
    duckdb_shell_sqlite3_free((void *)0x1dfdbc);
    OpenDB(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    if (*in_RDI == 0) {
      fprintf(_stderr,"Error: cannot open \'%s\'\n",local_28);
    }
  }
  if (*in_RDI == 0) {
    std::__cxx11::string::string(local_88);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x28),local_88);
    std::__cxx11::string::~string(local_88);
    OpenDB(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  return true;
}

Assistant:

bool ShellState::OpenDatabase(const char **azArg, idx_t nArg) {
	if (safe_mode) {
		utf8_printf(stderr, ".open cannot be used in -safe mode\n");
		return false;
	}
	char *zNewFilename;   /* Name of the database file to open */
	idx_t iName = 1;      /* Index in azArg[] of the filename */
	bool newFlag = false; /* True to delete file before opening */
	/* Close the existing database */
	close_db(db);
	db = nullptr;
	globalDb = nullptr;
	zDbFilename = string();
	openMode = SHELL_OPEN_UNSPEC;
	openFlags = openFlags & ~(SQLITE_OPEN_NOFOLLOW); // don't overwrite settings loaded in the command line
	szMax = 0;
	/* Check for command-line arguments */
	for (idx_t iName = 1; iName < nArg && azArg[iName][0] == '-'; iName++) {
		const char *z = azArg[iName];
		if (optionMatch(z, "new")) {
			newFlag = true;
		} else if (optionMatch(z, "readonly")) {
			openMode = SHELL_OPEN_READONLY;
		} else if (optionMatch(z, "nofollow")) {
			openFlags |= SQLITE_OPEN_NOFOLLOW;
		} else if (z[0] == '-') {
			utf8_printf(stderr, "unknown option: %s\n", z);
			return false;
		}
	}
	/* If a filename is specified, try to open it first */
	zNewFilename = nArg > iName ? sqlite3_mprintf("%s", azArg[iName]) : 0;
	if (zNewFilename || openMode == SHELL_OPEN_HEXDB) {
		if (newFlag) {
			shellDeleteFile(zNewFilename);
		}
		zDbFilename = zNewFilename;
		sqlite3_free(zNewFilename);
		OpenDB(OPEN_DB_KEEPALIVE);
		if (!db) {
			utf8_printf(stderr, "Error: cannot open '%s'\n", zNewFilename);
		}
	}
	if (!db) {
		/* As a fall-back open a TEMP database */
		zDbFilename = string();
		OpenDB(0);
	}
	return true;
}